

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int st__strhash(char *string,int modulus)

{
  uint uVar1;
  
  if (0 < modulus) {
    uVar1 = 0;
    for (; *string != 0; string = (char *)((byte *)string + 1)) {
      uVar1 = uVar1 * 0x3e5 + (uint)(byte)*string;
    }
    return uVar1 % (uint)modulus;
  }
  __assert_fail("modulus > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/st/st.c"
                ,0x1c5,"int st__strhash(const char *, int)");
}

Assistant:

int
 st__strhash(const char *string, int modulus)
{
    unsigned char * ustring = (unsigned char *)string;
    unsigned c, val = 0;
    assert( modulus > 0 );    
    while ((c = *ustring++) != '\0') {
        val = val*997 + c;
    }
    return (int)(val%modulus);
}